

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O2

bool __thiscall
MultiSigningProvider::GetPubKey(MultiSigningProvider *this,CKeyID *keyid,CPubKey *pubkey)

{
  long lVar1;
  pointer puVar2;
  SigningProvider *pSVar3;
  pointer puVar4;
  int iVar5;
  pointer puVar6;
  unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_> *provider;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (this->m_providers).
           super__Vector_base<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar4 = (this->m_providers).
           super__Vector_base<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    puVar6 = puVar4;
    if (puVar6 == puVar2) break;
    pSVar3 = (puVar6->_M_t).
             super___uniq_ptr_impl<SigningProvider,_std::default_delete<SigningProvider>_>._M_t.
             super__Tuple_impl<0UL,_SigningProvider_*,_std::default_delete<SigningProvider>_>.
             super__Head_base<0UL,_SigningProvider_*,_false>._M_head_impl;
    iVar5 = (*pSVar3->_vptr_SigningProvider[4])(pSVar3,keyid,pubkey);
    puVar4 = puVar6 + 1;
  } while ((char)iVar5 == '\0');
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return puVar6 != puVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool MultiSigningProvider::GetPubKey(const CKeyID& keyid, CPubKey& pubkey) const
{
    for (const auto& provider: m_providers) {
        if (provider->GetPubKey(keyid, pubkey)) return true;
    }
    return false;
}